

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall CVmImageLoader::load_sym_names(CVmImageLoader *this,ulong siz)

{
  CVmHashTable *this_00;
  uint uVar1;
  CVmHashEntry *this_01;
  ulong uVar2;
  ulong uVar3;
  ulong len;
  vm_val_t val;
  char buf [256];
  vm_val_t local_148;
  ushort local_138 [2];
  byte local_133;
  
  if (1 < siz) {
    (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_138,2);
    uVar1 = (uint)local_138[0];
    if (local_138[0] != 0) {
      uVar2 = siz - 2;
      do {
        if (uVar2 < 6) goto LAB_0029d682;
        uVar3 = uVar2 - 6;
        (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_138,6);
        local_148.typ = (vm_datatype_t)(char)local_138[0];
        vmb_get_dh_val((char *)local_138,&local_148);
        len = (ulong)local_133;
        uVar2 = uVar3 - len;
        if (uVar3 < len) goto LAB_0029d682;
        (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_138,len);
        this_00 = this->exports_;
        this_01 = (CVmHashEntry *)operator_new(0x38);
        CVmHashEntry::CVmHashEntry(this_01,(char *)local_138,len,1);
        this_01->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_0036e648;
        this_01[1]._vptr_CVmHashEntry = (_func_int **)CONCAT44(local_148._4_4_,local_148.typ);
        this_01[1].nxt_ = (CVmHashEntry *)local_148.val;
        CVmHashTable::add(this_00,this_01);
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    return;
  }
LAB_0029d682:
  err_throw(0x132);
}

Assistant:

void CVmImageLoader::read_data(char *buf, size_t read_len,
                               ulong *remaining_size)
{
    /* ensure we have enough data left in our block */
    if (read_len > *remaining_size)
        err_throw(VMERR_IMAGE_BLOCK_TOO_SMALL);

    /* decrement the remaining size counter for the data we just read */
    *remaining_size -= read_len;

    /* read the data */
    fp_->copy_data(buf, read_len);
}